

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall cmCTestTestCommand::InitializeHandler(cmCTestTestCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  cmCTestTestHandler *pcVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  char *pcVar8;
  string *psVar9;
  allocator<char> local_6f9;
  string local_6f8;
  cmValue local_6d8;
  cmValue labelsForSubprojects;
  ostringstream local_6b0 [8];
  ostringstream cmCTestLog_msg_1;
  string local_530 [32];
  ostringstream local_510 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_391;
  string local_390;
  cmValue local_370;
  cmValue ctestTestLoad;
  unsigned_long testLoad;
  string local_358;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  char local_179;
  cmAlphaNum local_178;
  cmAlphaNum local_148;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  cmCTestTestHandler *local_d0;
  cmCTestTestHandler *handler;
  string local_c0;
  cmValue local_a0;
  cmValue resourceSpecFile;
  int local_8c;
  duration<long,_std::ratio<60L,_1L>_> local_88;
  rep_conflict local_80;
  duration<double,_std::ratio<1L,_1L>_> local_78;
  rep_conflict local_70;
  double local_68;
  rep_conflict local_60;
  duration<double,_std::ratio<1L,_1L>_> local_58;
  cmDuration timeout;
  allocator<char> local_39;
  string local_38;
  cmValue local_18;
  cmValue ctestTimeout;
  cmCTestTestCommand *this_local;
  
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  ctestTimeout.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_TEST_TIMEOUT",&local_39);
  local_18 = cmMakefile::GetDefinition(pcVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  bVar4 = cmValue::operator_cast_to_bool(&local_18);
  if (bVar4) {
    cmValue::operator->[abi_cxx11_(&local_18);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    local_68 = atof(pcVar8);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_60,&local_68);
    local_58.__r = local_60;
  }
  else {
    local_70 = (rep_conflict)
               cmCTest::GetTimeOut((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
    local_58.__r = local_70;
    local_78 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
    bVar4 = std::chrono::operator<=(&local_58,&local_78);
    if (bVar4) {
      local_8c = 10;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,std::ratio<60l,1l>> *)&local_88,&local_8c);
      std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_80,&local_88);
      local_58.__r = local_80;
    }
  }
  resourceSpecFile.Value = (string *)local_58.__r;
  cmCTest::SetTimeOut((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                      (cmDuration)local_58.__r);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CTEST_RESOURCE_SPEC_FILE",(allocator<char> *)((long)&handler + 7))
  ;
  local_a0 = cmMakefile::GetDefinition(pcVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&handler + 7));
  uVar6 = std::__cxx11::string::empty();
  if (((uVar6 & 1) != 0) && (bVar4 = cmValue::operator_cast_to_bool(&local_a0), bVar4)) {
    psVar9 = cmValue::operator*[abi_cxx11_(&local_a0);
    std::__cxx11::string::operator=((string *)&this->ResourceSpecFile,(string *)psVar9);
  }
  iVar5 = (*(this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand
            [9])();
  local_d0 = (cmCTestTestHandler *)CONCAT44(extraout_var,iVar5);
  uVar6 = std::__cxx11::string::empty();
  if ((((uVar6 & 1) == 0) || (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) ||
     (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
    pcVar3 = local_d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"TestsToRunInformation",&local_f1);
    cmAlphaNum::cmAlphaNum(&local_148,&this->Start);
    cmAlphaNum::cmAlphaNum(&local_178,',');
    local_179 = ',';
    cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
              (&local_118,&local_148,&local_178,&this->End,&local_179,&this->Stride);
    cmCTestGenericHandler::SetOption(&pcVar3->super_cmCTestGenericHandler,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  uVar6 = std::__cxx11::string::empty();
  pcVar3 = local_d0;
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"ExcludeRegularExpression",&local_1a1);
    cmCTestGenericHandler::SetOption(&pcVar3->super_cmCTestGenericHandler,&local_1a0,&this->Exclude)
    ;
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
  }
  uVar6 = std::__cxx11::string::empty();
  pcVar3 = local_d0;
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"IncludeRegularExpression",&local_1c9);
    cmCTestGenericHandler::SetOption(&pcVar3->super_cmCTestGenericHandler,&local_1c8,&this->Include)
    ;
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
  }
  uVar6 = std::__cxx11::string::empty();
  pcVar3 = local_d0;
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"ExcludeLabelRegularExpression",&local_1f1);
    cmCTestGenericHandler::AddMultiOption
              (&pcVar3->super_cmCTestGenericHandler,&local_1f0,&this->ExcludeLabel);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
  }
  uVar6 = std::__cxx11::string::empty();
  pcVar3 = local_d0;
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"LabelRegularExpression",&local_219);
    cmCTestGenericHandler::AddMultiOption
              (&pcVar3->super_cmCTestGenericHandler,&local_218,&this->IncludeLabel);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
  }
  uVar6 = std::__cxx11::string::empty();
  pcVar3 = local_d0;
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"ExcludeFixtureRegularExpression",&local_241);
    cmCTestGenericHandler::SetOption
              (&pcVar3->super_cmCTestGenericHandler,&local_240,&this->ExcludeFixture);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
  }
  uVar6 = std::__cxx11::string::empty();
  pcVar3 = local_d0;
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"ExcludeFixtureSetupRegularExpression",&local_269);
    cmCTestGenericHandler::SetOption
              (&pcVar3->super_cmCTestGenericHandler,&local_268,&this->ExcludeFixtureSetup);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
  }
  uVar6 = std::__cxx11::string::empty();
  pcVar3 = local_d0;
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"ExcludeFixtureCleanupRegularExpression",&local_291);
    cmCTestGenericHandler::SetOption
              (&pcVar3->super_cmCTestGenericHandler,&local_290,&this->ExcludeFixtureCleanup);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
  }
  pcVar3 = local_d0;
  if ((this->StopOnFailure & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"StopOnFailure",&local_2b9);
    cmCTestGenericHandler::SetOption(&pcVar3->super_cmCTestGenericHandler,&local_2b8,"ON");
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
  }
  uVar6 = std::__cxx11::string::empty();
  pcVar3 = local_d0;
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ParallelLevel",&local_2e1);
    cmCTestGenericHandler::SetOption
              (&pcVar3->super_cmCTestGenericHandler,&local_2e0,&this->ParallelLevel);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
  }
  uVar6 = std::__cxx11::string::empty();
  pcVar3 = local_d0;
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"Repeat",&local_309);
    cmCTestGenericHandler::SetOption(&pcVar3->super_cmCTestGenericHandler,&local_308,&this->Repeat);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator(&local_309);
  }
  uVar6 = std::__cxx11::string::empty();
  pcVar3 = local_d0;
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,"ScheduleRandom",&local_331);
    cmCTestGenericHandler::SetOption
              (&pcVar3->super_cmCTestGenericHandler,&local_330,&this->ScheduleRandom);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator(&local_331);
  }
  uVar6 = std::__cxx11::string::empty();
  pcVar3 = local_d0;
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"ResourceSpecFile",(allocator<char> *)((long)&testLoad + 7));
    cmCTestGenericHandler::SetOption
              (&pcVar3->super_cmCTestGenericHandler,&local_358,&this->ResourceSpecFile);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator((allocator<char> *)((long)&testLoad + 7));
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    cmCTest::SetStopTime
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,&this->StopTime);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"CTEST_TEST_LOAD",&local_391);
  local_370 = cmMakefile::GetDefinition(pcVar1,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    bVar4 = cmStrToULong(&this->TestLoad,(unsigned_long *)&ctestTestLoad);
    if (!bVar4) {
      ctestTestLoad.Value = (string *)0x0;
      std::__cxx11::ostringstream::ostringstream(local_510);
      poVar7 = std::operator<<((ostream *)local_510,"Invalid value for \'TEST_LOAD\' : ");
      poVar7 = std::operator<<(poVar7,(string *)&this->TestLoad);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestCommand.cxx"
                   ,0x7b,pcVar8,false);
      std::__cxx11::string::~string(local_530);
      std::__cxx11::ostringstream::~ostringstream(local_510);
    }
  }
  else {
    bVar4 = cmNonempty(local_370);
    if (bVar4) {
      psVar9 = cmValue::operator*[abi_cxx11_(&local_370);
      bVar4 = cmStrToULong(psVar9,(unsigned_long *)&ctestTestLoad);
      if (!bVar4) {
        ctestTestLoad.Value = (string *)0x0;
        std::__cxx11::ostringstream::ostringstream(local_6b0);
        poVar7 = std::operator<<((ostream *)local_6b0,"Invalid value for \'CTEST_TEST_LOAD\' : ");
        psVar9 = cmValue::operator*[abi_cxx11_(&local_370);
        poVar7 = std::operator<<(poVar7,(string *)psVar9);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestCommand.cxx"
                     ,0x82,pcVar8,false);
        std::__cxx11::string::~string((string *)&labelsForSubprojects);
        std::__cxx11::ostringstream::~ostringstream(local_6b0);
      }
    }
    else {
      ctestTestLoad.Value =
           (string *)
           cmCTest::GetTestLoad((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
    }
  }
  cmCTestGenericHandler::SetTestLoad
            (&local_d0->super_cmCTestGenericHandler,(unsigned_long)ctestTestLoad.Value);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"CTEST_LABELS_FOR_SUBPROJECTS",&local_6f9);
  local_6d8 = cmMakefile::GetDefinition(pcVar1,&local_6f8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  bVar4 = cmValue::operator_cast_to_bool(&local_6d8);
  if (bVar4) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    psVar9 = cmValue::operator*[abi_cxx11_(&local_6d8);
    cmCTest::SetCTestConfiguration
              (pcVar2,"LabelsForSubprojects",psVar9,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    cmCTestTestHandler::SetJUnitXMLFileName(local_d0,&this->OutputJUnit);
  }
  cmCTestGenericHandler::SetQuiet
            (&local_d0->super_cmCTestGenericHandler,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  return &local_d0->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestTestCommand::InitializeHandler()
{
  cmValue ctestTimeout = this->Makefile->GetDefinition("CTEST_TEST_TIMEOUT");

  cmDuration timeout;
  if (ctestTimeout) {
    timeout = cmDuration(atof(ctestTimeout->c_str()));
  } else {
    timeout = this->CTest->GetTimeOut();
    if (timeout <= cmDuration::zero()) {
      // By default use timeout of 10 minutes
      timeout = std::chrono::minutes(10);
    }
  }
  this->CTest->SetTimeOut(timeout);

  cmValue resourceSpecFile =
    this->Makefile->GetDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (this->ResourceSpecFile.empty() && resourceSpecFile) {
    this->ResourceSpecFile = *resourceSpecFile;
  }

  cmCTestTestHandler* handler = this->InitializeActualHandler();
  if (!this->Start.empty() || !this->End.empty() || !this->Stride.empty()) {
    handler->SetOption(
      "TestsToRunInformation",
      cmStrCat(this->Start, ',', this->End, ',', this->Stride));
  }
  if (!this->Exclude.empty()) {
    handler->SetOption("ExcludeRegularExpression", this->Exclude);
  }
  if (!this->Include.empty()) {
    handler->SetOption("IncludeRegularExpression", this->Include);
  }
  if (!this->ExcludeLabel.empty()) {
    handler->AddMultiOption("ExcludeLabelRegularExpression",
                            this->ExcludeLabel);
  }
  if (!this->IncludeLabel.empty()) {
    handler->AddMultiOption("LabelRegularExpression", this->IncludeLabel);
  }
  if (!this->ExcludeFixture.empty()) {
    handler->SetOption("ExcludeFixtureRegularExpression",
                       this->ExcludeFixture);
  }
  if (!this->ExcludeFixtureSetup.empty()) {
    handler->SetOption("ExcludeFixtureSetupRegularExpression",
                       this->ExcludeFixtureSetup);
  }
  if (!this->ExcludeFixtureCleanup.empty()) {
    handler->SetOption("ExcludeFixtureCleanupRegularExpression",
                       this->ExcludeFixtureCleanup);
  }
  if (this->StopOnFailure) {
    handler->SetOption("StopOnFailure", "ON");
  }
  if (!this->ParallelLevel.empty()) {
    handler->SetOption("ParallelLevel", this->ParallelLevel);
  }
  if (!this->Repeat.empty()) {
    handler->SetOption("Repeat", this->Repeat);
  }
  if (!this->ScheduleRandom.empty()) {
    handler->SetOption("ScheduleRandom", this->ScheduleRandom);
  }
  if (!this->ResourceSpecFile.empty()) {
    handler->SetOption("ResourceSpecFile", this->ResourceSpecFile);
  }
  if (!this->StopTime.empty()) {
    this->CTest->SetStopTime(this->StopTime);
  }

  // Test load is determined by: TEST_LOAD argument,
  // or CTEST_TEST_LOAD script variable, or ctest --test-load
  // command line argument... in that order.
  unsigned long testLoad;
  cmValue ctestTestLoad = this->Makefile->GetDefinition("CTEST_TEST_LOAD");
  if (!this->TestLoad.empty()) {
    if (!cmStrToULong(this->TestLoad, &testLoad)) {
      testLoad = 0;
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'TEST_LOAD' : " << this->TestLoad
                                                    << std::endl);
    }
  } else if (cmNonempty(ctestTestLoad)) {
    if (!cmStrToULong(*ctestTestLoad, &testLoad)) {
      testLoad = 0;
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'CTEST_TEST_LOAD' : " << *ctestTestLoad
                                                          << std::endl);
    }
  } else {
    testLoad = this->CTest->GetTestLoad();
  }
  handler->SetTestLoad(testLoad);

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  if (!this->OutputJUnit.empty()) {
    handler->SetJUnitXMLFileName(this->OutputJUnit);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}